

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Const * kratos::Const::constant(int64_t value,uint32_t width,bool is_signed)

{
  element_type *peVar1;
  undefined1 local_28 [8];
  shared_ptr<kratos::Const> p;
  bool is_signed_local;
  int64_t iStack_10;
  uint32_t width_local;
  int64_t value_local;
  
  p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ =
       is_signed;
  p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = width;
  iStack_10 = value;
  std::make_shared<kratos::Const,long&,unsigned_int&,bool&>
            ((long *)local_28,(uint *)&stack0xfffffffffffffff0,
             (bool *)((long)&p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
  std::
  unordered_set<std::shared_ptr<kratos::Const>,std::hash<std::shared_ptr<kratos::Const>>,std::equal_to<std::shared_ptr<kratos::Const>>,std::allocator<std::shared_ptr<kratos::Const>>>
  ::emplace<std::shared_ptr<kratos::Const>&>
            ((unordered_set<std::shared_ptr<kratos::Const>,std::hash<std::shared_ptr<kratos::Const>>,std::equal_to<std::shared_ptr<kratos::Const>>,std::allocator<std::shared_ptr<kratos::Const>>>
              *)consts_,(shared_ptr<kratos::Const> *)local_28);
  peVar1 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )local_28);
  std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)local_28);
  return peVar1;
}

Assistant:

Const &Const::constant(int64_t value, uint32_t width, bool is_signed) {
    auto p = std::make_shared<Const>(value, width, is_signed);
    consts_.emplace(p);
    return *p;
}